

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O3

bool __thiscall pstore::uuid::is_null(uuid *this)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = 5;
  lVar1 = 3;
  do {
    if ((this->data_)._M_elems[lVar1 + -3] != '\0') {
      lVar1 = lVar1 + -3;
      goto LAB_00131724;
    }
    if ((this->data_)._M_elems[lVar1 + -2] != '\0') {
      lVar1 = lVar1 + -2;
      goto LAB_00131724;
    }
    if ((this->data_)._M_elems[lVar1 + -1] != '\0') {
      lVar1 = lVar1 + -1;
      goto LAB_00131724;
    }
    if ((this->data_)._M_elems[lVar1] != '\0') goto LAB_00131724;
    uVar2 = uVar2 - 1;
    lVar1 = lVar1 + 4;
  } while (1 < uVar2);
  lVar1 = 0x10;
LAB_00131724:
  return lVar1 == 0x10;
}

Assistant:

bool uuid::is_null () const noexcept {
        return std::all_of (std::begin (data_), std::end (data_), [] (auto const v) { return !v; });
    }